

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_bfba::TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
          (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  size_t __n;
  ktx_uint8_t *pImage;
  void *__s1;
  long lVar18;
  
  pvVar3 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)(this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).images.
                 super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
  if (lVar17 != 0) {
    uVar1 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).width;
    uVar2 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).height;
    pvVar4 = (pvVar3->
             super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = *(pointer *)
              ((long)&(pvVar3->
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data + 8);
    uVar12 = 0;
    do {
      uVar8 = uVar1 >> ((byte)uVar12 & 0x1f);
      __n = (ulong)uVar8 * 3;
      if (uVar8 == 0) {
        __n = 3;
      }
      uVar8 = uVar2 >> ((byte)uVar12 & 0x1f);
      uVar10 = (ulong)(uVar8 + (uVar8 == 0));
      if (pvVar5 != pvVar4) {
        uVar8 = (int)__n - 1U & 3;
        lVar18 = (uVar8 ^ 3) + __n;
        lVar6 = *(long *)&pvVar3[uVar12].
                          super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                          ._M_impl;
        uVar11 = 0;
        do {
          lVar7 = *(long *)(lVar6 + uVar11 * 0x18);
          lVar13 = *(long *)(lVar6 + 8 + uVar11 * 0x18) - lVar7;
          if (lVar13 != 0) {
            uVar14 = 0;
            do {
              __s1 = *(void **)(lVar7 + uVar14 * 0x18);
              uVar16 = uVar10;
              if (uVar8 == 3) {
                iVar9 = bcmp(__s1,pData,*(long *)(lVar7 + uVar14 * 0x18 + 8) - (long)__s1);
                if (iVar9 != 0) {
                  return false;
                }
                pData = pData + uVar10 * lVar18;
              }
              else {
                do {
                  iVar9 = bcmp(__s1,pData,__n);
                  if (iVar9 != 0) {
                    return false;
                  }
                  __s1 = (void *)((long)__s1 + __n);
                  pData = pData + lVar18;
                  uVar15 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar15;
                } while (uVar15 != 0);
              }
              uVar14 = (ulong)((int)uVar14 + 1);
            } while (uVar14 < (ulong)((lVar13 >> 3) * -0x5555555555555555));
          }
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar11 < (ulong)(((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555));
      }
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (uVar12 < (ulong)((lVar17 >> 3) * -0x5555555555555555));
  }
  return true;
}

Assistant:

bool
    compareTexture1Images(ktx_uint8_t* pData)
    {
        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_size_t rowBytes = levelWidth * sizeof(component_type) * numComponents;
            ktx_uint32_t rowPadding = ROUNDING(rowBytes);
            ktx_size_t paddedImageBytes = (rowBytes + rowPadding) * levelHeight;
            for (ktx_uint32_t layer = 0; layer < images[0].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(), pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += rowBytes + rowPadding;
                        }
                    }
                }
            }
        }
        return true;
    }